

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O2

void M3x3_RotateX(double (*input) [3],double degrees,double (*result) [3])

{
  double dVar1;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  local_38 = IdentityMatrix[2][0];
  dStack_30 = IdentityMatrix[2][1];
  local_48 = IdentityMatrix[1][1];
  dStack_40 = IdentityMatrix[1][2];
  local_58 = IdentityMatrix[0][2];
  dStack_50 = IdentityMatrix[1][0];
  local_68 = IdentityMatrix[0][0];
  dStack_60 = IdentityMatrix[0][1];
  dVar1 = cos(degrees * 0.017453292519943295);
  dStack_30 = sin(degrees * 0.017453292519943295);
  dStack_40 = -dStack_30;
  local_48 = dVar1;
  local_28 = dVar1;
  M3x3_MulMatrix((double (*) [3])&local_68,input,result);
  return;
}

Assistant:

void M3x3_RotateX(double input[3][3], double degrees, double result[3][3])
{
	double 	transformationmatrix[3][3];
  	double  sinvalue, cosvalue, radians;

    M3x3_LoadIdentity(transformationmatrix);

	radians = degrees * (M_PI/180.0);
	cosvalue = cos(radians);
	sinvalue = sin(radians);

	transformationmatrix[1][1] =  cosvalue;
	transformationmatrix[1][2] = -sinvalue;
	transformationmatrix[2][1] =  sinvalue;
	transformationmatrix[2][2] =  cosvalue;

	M3x3_MulMatrix(transformationmatrix, input, result);
}